

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.h
# Opt level: O2

size_type __thiscall bitmap::Bitmap::Deserialize(Bitmap *this,istream *in)

{
  data_type *pdVar1;
  uint64_t i;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  
  sVar3 = 8;
  std::istream::read((char *)in,(long)&this->size_);
  uVar4 = this->size_;
  pdVar1 = (data_type *)operator_new__((((uVar4 >> 6) + 1) - (ulong)((uVar4 & 0x3f) == 0)) * 8);
  this->data_ = pdVar1;
  for (uVar2 = 0; uVar2 < ((uVar4 >> 6) + 1) - (ulong)((uVar4 & 0x3f) == 0); uVar2 = uVar2 + 1) {
    std::istream::read((char *)in,(long)this->data_ + (sVar3 - 8));
    sVar3 = sVar3 + 8;
    uVar4 = this->size_;
  }
  return sVar3;
}

Assistant:

Bitmap::size_type Bitmap::Deserialize(std::istream& in) {
  size_t in_size = 0;

  in.read(reinterpret_cast<char *>(&size_), sizeof(uint64_t));
  in_size += sizeof(uint64_t);

  data_ = new uint64_t[BITS2BLOCKS(size_)];
  for (uint64_t i = 0; i < BITS2BLOCKS(size_); i++) {
    in.read(reinterpret_cast<char *>(&data_[i]), sizeof(uint64_t));
    in_size += sizeof(uint64_t);
  }

  return in_size;
}